

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QLocale>::emplace<QLocale>
          (QMovableArrayOps<QLocale> *this,qsizetype i,QLocale *args)

{
  bool bVar1;
  qsizetype qVar2;
  QLocale *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QLocale tmp;
  QLocale *in_stack_ffffffffffffff78;
  Inserter *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff9c;
  QArrayDataPointer<QLocale> *in_stack_ffffffffffffffa0;
  Inserter local_38;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QLocale>::needsDetach
                    ((QArrayDataPointer<QLocale> *)in_stack_ffffffffffffff80);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QLocale>::freeSpaceAtEnd
                          ((QArrayDataPointer<QLocale> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar2 != 0)) {
      QArrayDataPointer<QLocale>::end((QArrayDataPointer<QLocale> *)in_stack_ffffffffffffff80);
      QLocale::QLocale((QLocale *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceTo = (QLocale *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_004f71b1;
    }
    if ((in_RSI == (QLocale *)0x0) &&
       (qVar2 = QArrayDataPointer<QLocale>::freeSpaceAtBegin
                          ((QArrayDataPointer<QLocale> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar2 != 0)) {
      QArrayDataPointer<QLocale>::begin((QArrayDataPointer<QLocale> *)0x4f705a);
      QLocale::QLocale((QLocale *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QLocale *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_004f71b1;
    }
  }
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QLocale::QLocale((QLocale *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar1 = in_RDI->displaceTo != (QLocale *)0x0;
  uVar3 = bVar1 && in_RSI == (QLocale *)0x0;
  QArrayDataPointer<QLocale>::detachAndGrow
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(qsizetype)in_RDI,
             (QLocale **)CONCAT17(uVar3,in_stack_ffffffffffffff88),
             (QArrayDataPointer<QLocale> *)in_stack_ffffffffffffff80);
  if (bVar1 && in_RSI == (QLocale *)0x0) {
    QArrayDataPointer<QLocale>::begin((QArrayDataPointer<QLocale> *)0x4f710d);
    QLocale::QLocale((QLocale *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QLocale *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
  }
  else {
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QLocale> *)
                              CONCAT17(uVar3,in_stack_ffffffffffffff88),
                       (qsizetype)in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertOne(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Inserter::~Inserter(&local_38);
  }
  QLocale::~QLocale((QLocale *)0x4f71b1);
LAB_004f71b1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }